

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<StateMapper,_StateMapper>::ShrinkToFit(TArray<StateMapper,_StateMapper> *this)

{
  uint uVar1;
  StateMapper *pSVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (StateMapper *)0x0) {
        return;
      }
      M_Free(this->Array);
      pSVar2 = (StateMapper *)0x0;
    }
    else {
      pSVar2 = (StateMapper *)
               M_Realloc_Dbg(this->Array,(ulong)uVar1 << 5,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x1ad);
    }
    this->Array = pSVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}